

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManResetMatches(Nf_Man_t *p,int Round)

{
  word *pwVar1;
  uint *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  Nf_Mat_t *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Nf_Cfg_t NVar8;
  Gia_Man_t *pGVar9;
  Nf_Obj_t *pNVar10;
  uint uVar11;
  undefined1 *puVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  word wVar20;
  Nf_Mat_t t;
  Nf_Mat_t *pM [2];
  long local_70;
  Nf_Obj_t *local_48;
  Nf_Mat_t (*local_40) [2];
  
  pGVar9 = p->pGia;
  if (0 < pGVar9->nObjs) {
    local_70 = 0;
    lVar16 = 0;
    lVar17 = 0;
    do {
      if (pGVar9->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar3 = *(ulong *)(pGVar9->pObjs + lVar17);
      uVar13 = (uint)uVar3;
      if ((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) {
        if ((((int)uVar13 < 0) || (uVar13 = uVar13 & 0x1fffffff, uVar13 == 0x1fffffff)) ||
           (uVar13 != ((uint)(uVar3 >> 0x20) & 0x1fffffff))) {
          lVar15 = 0;
          lVar14 = local_70;
          do {
            pNVar10 = p->pNfObjs;
            *(undefined8 *)((long)&pNVar10->M[0][1].A + lVar15 * 4 + lVar16) = 0;
            *(undefined8 *)((long)&pNVar10->M[0][0].A + lVar15 * 4 + lVar16) = 0;
            if ((p->vMapRefs).nSize <= (int)lVar14) goto LAB_006f9423;
            puVar2 = (uint *)(&pNVar10->M[0][0].field_0x0 + lVar15 * 4 + lVar16);
            if ((p->vMapRefs).pArray[lVar14] == 0) {
              if ((Round < 1) && (((int)*puVar2 < 0 || ((int)puVar2[6] < 0)))) {
                __assert_fail("Round > 0 || (!pDc->fBest && !pAc->fBest)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x769,"void Nf_ManResetMatches(Nf_Man_t *, int)");
              }
              if ((p->pPars->fAreaOnly != 0 || (Round & 1U) != 0) &&
                 ((*(byte *)((long)puVar2 + 0x1b) & 0x40) == 0)) {
                uVar4 = *(undefined8 *)(puVar2 + 4);
                uVar6 = *(undefined8 *)puVar2;
                uVar7 = *(undefined8 *)(puVar2 + 2);
                *(undefined8 *)(puVar2 + 4) = *(undefined8 *)(puVar2 + 10);
                *(undefined8 *)puVar2 = *(undefined8 *)(puVar2 + 6);
                *(undefined8 *)(puVar2 + 2) = *(undefined8 *)(puVar2 + 8);
                *(undefined8 *)(puVar2 + 10) = uVar4;
                *(undefined8 *)(puVar2 + 6) = uVar6;
                *(undefined8 *)(puVar2 + 8) = uVar7;
              }
              *(byte *)((long)puVar2 + 3) = *(byte *)((long)puVar2 + 3) | 0x80;
              *(byte *)((long)puVar2 + 0x1b) = *(byte *)((long)puVar2 + 0x1b) & 0x7f;
            }
            else {
              if (-1 < (int)(*puVar2 ^ puVar2[6])) {
                __assert_fail("pDc->fBest != pAc->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x761,"void Nf_ManResetMatches(Nf_Man_t *, int)");
              }
              if ((int)puVar2[6] < 0) {
                uVar4 = *(undefined8 *)(puVar2 + 4);
                uVar6 = *(undefined8 *)puVar2;
                uVar7 = *(undefined8 *)(puVar2 + 2);
                *(undefined8 *)(puVar2 + 4) = *(undefined8 *)(puVar2 + 10);
                *(undefined8 *)puVar2 = *(undefined8 *)(puVar2 + 6);
                *(undefined8 *)(puVar2 + 2) = *(undefined8 *)(puVar2 + 8);
                *(undefined8 *)(puVar2 + 10) = uVar4;
                *(undefined8 *)(puVar2 + 6) = uVar6;
                *(undefined8 *)(puVar2 + 8) = uVar7;
              }
              if (-1 < (int)*puVar2) {
                __assert_fail("pDc->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x764,"void Nf_ManResetMatches(Nf_Man_t *, int)");
              }
              if ((int)puVar2[6] < 0) {
                __assert_fail("!pAc->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x765,"void Nf_ManResetMatches(Nf_Man_t *, int)");
              }
            }
            lVar15 = lVar15 + 0xc;
            lVar14 = lVar14 + 1;
          } while (lVar15 == 0xc);
          local_48 = p->pNfObjs + lVar17;
          pNVar10 = p->pNfObjs + lVar17;
          local_40 = pNVar10->M + 1;
          uVar13 = *(uint *)pNVar10->M[0];
          if ((-1 < (int)uVar13) || (uVar11 = *(uint *)*local_40, -1 < (int)uVar11)) {
            __assert_fail("pM[0]->fBest && pM[1]->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x773,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          if (((uVar13 & uVar11) >> 0x1e & 1) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x779,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          if (((uVar11 | uVar13) >> 0x1e & 1) == 0) {
            lVar14 = 0;
            do {
              if ((p->vCutSets).nSize <= lVar17) goto LAB_006f9423;
              uVar13 = (p->vCutSets).pArray[lVar17];
              uVar11 = (int)uVar13 >> 0x10;
              if (((int)uVar11 < 0) || ((p->vPages).nSize <= (int)uVar11)) goto LAB_006f9442;
              pNVar5 = (Nf_Mat_t *)(&local_48)[lVar14];
              wVar20 = Nf_ManComputeArrival
                                 (p,pNVar5,(int *)((ulong)((uVar13 & 0xffff) << 2) +
                                                  (long)(p->vPages).pArray[uVar11]));
              pNVar5->D = wVar20;
              lVar14 = lVar14 + 1;
            } while (lVar14 == 1);
          }
          else {
            pNVar5 = (Nf_Mat_t *)(&local_48)[(uVar11 & 0x40000000) == 0];
            if ((pNVar5->field_0x3 & 0x40) != 0) {
              __assert_fail("!pM[c]->fCompl",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x789,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            pNVar10 = (&local_48)[(uVar11 & 0x40000000) >> 0x1e];
            if ((pNVar10->M[0][0].field_0x3 & 0x40) == 0) {
              __assert_fail("pM[!c]->fCompl",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x78a,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if ((p->vCutSets).nSize <= lVar17) {
LAB_006f9423:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar13 = (p->vCutSets).pArray[lVar17];
            uVar11 = (int)uVar13 >> 0x10;
            if (((int)uVar11 < 0) || ((p->vPages).nSize <= (int)uVar11)) {
LAB_006f9442:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            wVar20 = Nf_ManComputeArrival
                               (p,pNVar5,(int *)((ulong)((uVar13 & 0xffff) << 2) +
                                                (long)(p->vPages).pArray[uVar11]));
            pNVar5->D = wVar20;
            pNVar10->M[0][0].A = pNVar5->A;
            NVar8 = pNVar5->Cfg;
            wVar20 = pNVar5->D;
            *(undefined4 *)&pNVar10->M[0][0].field_0x0 = *(undefined4 *)&pNVar5->field_0x0;
            pNVar10->M[0][0].Cfg = NVar8;
            pNVar10->M[0][0].D = wVar20;
            pwVar1 = &pNVar10->M[0][0].D;
            *pwVar1 = *pwVar1 + p->InvDelay;
            puVar12 = &pNVar10->M[0][0].field_0x3;
            *puVar12 = *puVar12 | 0x40;
          }
        }
        else {
          iVar18 = (int)lVar17 - uVar13;
          pNVar10 = p->pNfObjs;
          uVar19 = ((uint)(uVar3 >> 0x1d) & 1) * 0x30;
          uVar13 = *(uint *)(&pNVar10[iVar18].M[0][0].field_0x0 + uVar19);
          uVar11 = *(uint *)(&pNVar10[iVar18].M[0][1].field_0x0 + uVar19);
          if (-1 < (int)(uVar11 ^ uVar13)) {
            __assert_fail("pD->fBest != pA->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x586,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
          }
          puVar12 = &pNVar10[iVar18].M[0][0].field_0x0 + uVar19;
          if (-1 < (int)uVar13) {
            puVar12 = (undefined1 *)0x0;
          }
          if ((int)uVar11 < 0) {
            puVar12 = &pNVar10[iVar18].M[0][1].field_0x0 + uVar19;
          }
          lVar14 = 0;
          do {
            *(undefined8 *)((long)&pNVar10->M[0][1].A + lVar14 + lVar16) = 0;
            *(undefined8 *)((long)&pNVar10->M[0][0].A + lVar14 + lVar16) = 0;
            wVar20 = 0;
            if (lVar14 != 0) {
              wVar20 = p->InvArea;
            }
            *(word *)((long)&pNVar10->M[0][0].D + lVar14 + lVar16) = wVar20 + *(word *)(puVar12 + 8)
            ;
            uVar13 = *(uint *)(&pNVar10->M[0][0].field_0x0 + lVar14 + lVar16);
            if (-1 < (int)uVar13) {
              __assert_fail("pDc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x753,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if (*(int *)(&pNVar10->M[0][1].field_0x0 + lVar14 + lVar16) < 0) {
              __assert_fail("!pAc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x754,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if ((lVar14 != 0) && ((uVar13 & 0x40000000) == 0)) {
              __assert_fail("c==0 || pDc->fCompl",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x755,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            lVar14 = lVar14 + 0x30;
          } while (lVar14 == 0x30);
        }
      }
      lVar17 = lVar17 + 1;
      pGVar9 = p->pGia;
      lVar16 = lVar16 + 0x60;
      local_70 = local_70 + 2;
    } while (lVar17 < pGVar9->nObjs);
  }
  return;
}

Assistant:

void Nf_ManResetMatches( Nf_Man_t * p, int Round )
{
    Gia_Obj_t * pObj;
    Nf_Mat_t * pDc, * pAc, * pMfan, * pM[2]; 
    word Arrival; int i, c;
    // go through matches in the topo order
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pMfan = Nf_ObjMatchBest( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj) );
            for ( c = 0; c < 2; c++ )
            {
                pDc = Nf_ObjMatchD( p, i, c );
                pAc = Nf_ObjMatchA( p, i, c );
                pDc->A = pAc->A = 0;
                pDc->D = pMfan->D + (c ? p->InvArea : 0); 
                assert( pDc->fBest );
                assert( !pAc->fBest );
                assert( c==0 || pDc->fCompl );
            }
            continue;
        }
        // select the best match for each phase
        for ( c = 0; c < 2; c++ )
        {
            pDc = Nf_ObjMatchD( p, i, c );
            pAc = Nf_ObjMatchA( p, i, c );
            pDc->A = pAc->A = 0;
            if ( Nf_ObjMapRefNum(p, i, c) )
            {
                assert( pDc->fBest != pAc->fBest );
                if ( pAc->fBest )
                    ABC_SWAP( Nf_Mat_t, *pDc, *pAc );
                assert( pDc->fBest );
                assert( !pAc->fBest );
            }
            else
            {
                assert( Round > 0 || (!pDc->fBest && !pAc->fBest) );
                if ( (p->pPars->fAreaOnly || (Round & 1)) && !pAc->fCompl )
                    ABC_SWAP( Nf_Mat_t, *pDc, *pAc );
                pDc->fBest = 1;
                pAc->fBest = 0;
            }
        }
        // consider best matches of both phases
        pM[0] = Nf_ObjMatchD( p, i, 0 );
        pM[1] = Nf_ObjMatchD( p, i, 1 );
        assert( pM[0]->fBest && pM[1]->fBest );
        // swap complemented matches
        if ( pM[0]->fCompl && pM[1]->fCompl )
        {
//            pM[0]->fCompl = pM[1]->fCompl = 0;
//            ABC_SWAP( Nf_Mat_t *, pM[0], pM[1] );
            assert( 0 );
        }
        if ( !pM[0]->fCompl && !pM[1]->fCompl )
        {
            for ( c = 0; c < 2; c++ )
            {
                Arrival = Nf_ManComputeArrival( p, pM[c], Nf_ObjCutSet(p, i) );
                //if ( Nf_ObjMapRefNum(p, i, c) )
                //    assert( Round || Arrival <= pM[c]->D );
                pM[c]->D = Arrival;
            }
        }
        else 
        {
            // consider non-complemented match
            c = !pM[1]->fCompl;
            assert( !pM[c]->fCompl );
            assert( pM[!c]->fCompl );
            Arrival = Nf_ManComputeArrival( p, pM[c], Nf_ObjCutSet(p, i) );
            //if ( Nf_ObjMapRefNum(p, i, c) )
            //    assert( Round || Arrival <= pM[c]->D );
            pM[c]->D = Arrival;
            // consider complemented match
            Arrival = pM[!c]->D;
            *pM[!c] = *pM[c];
            pM[!c]->D += p->InvDelay;
            pM[!c]->fCompl = 1;
            //if ( Nf_ObjMapRefNum(p, i, !c) )
            //    assert( Round || pM[!c]->D <= Arrival );
        }
    }
}